

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::TooFewItems(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
              *this,SizeType actualCount,SizeType expectedCount)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *actual;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *expected;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_38;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_28;
  SizeType local_18;
  SizeType local_14;
  SizeType expectedCount_local;
  SizeType actualCount_local;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  local_18 = expectedCount;
  local_14 = actualCount;
  _expectedCount_local = this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue(&local_28,actualCount);
  actual = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_28);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GenericValue(&local_38,local_18);
  expected = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Move(&local_38);
  AddNumberError(this,kValidateErrorMinItems,actual,expected,(_func_ValueType_ptr *)0x0);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_38);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&local_28);
  return;
}

Assistant:

void TooFewItems(SizeType actualCount, SizeType expectedCount) {
        AddNumberError(kValidateErrorMinItems,
            ValueType(actualCount).Move(), SValue(expectedCount).Move());
    }